

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O3

size_t ZSTD_compressContinue_internal
                 (ZSTD_CCtx *cctx,void *dst,size_t dstCapacity,void *src,size_t srcSize,U32 frame,
                 U32 lastFrameChunk)

{
  ZSTD_matchState_t *ms;
  void *iend;
  uint uVar1;
  BYTE *pBVar2;
  BYTE *pBVar3;
  BYTE *pBVar4;
  ZSTD_compressedBlockState_t *pZVar5;
  ushort uVar6;
  uint uVar7;
  size_t err_code;
  size_t sVar8;
  size_t sVar9;
  ulong uVar10;
  ZSTD_compressedBlockState_t *pZVar11;
  size_t sVar12;
  ushort uVar13;
  uint uVar14;
  U32 UVar15;
  ulong uVar16;
  BYTE *pBVar17;
  short *dst_00;
  uint uVar18;
  size_t err_code_2;
  size_t sVar19;
  unsigned_long_long uVar20;
  bool bVar21;
  
  if (cctx->stage == ZSTDcs_created) {
    uVar16 = 0xffffffffffffffc4;
  }
  else {
    if (cctx->stage == ZSTDcs_init && frame != 0) {
      sVar8 = ZSTD_writeFrameHeader
                        (dst,dstCapacity,&cctx->appliedParams,cctx->pledgedSrcSizePlusOne - 1,
                         cctx->dictID);
      if (0xffffffffffffff88 < sVar8) {
        return sVar8;
      }
      bVar21 = dstCapacity < sVar8;
      dstCapacity = dstCapacity - sVar8;
      if (bVar21) {
        __assert_fail("fhSize <= dstCapacity",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                      ,0x34e1,
                      "size_t ZSTD_compressContinue_internal(ZSTD_CCtx *, void *, size_t, const void *, size_t, U32, U32)"
                     );
      }
      dst = (void *)((long)dst + sVar8);
      cctx->stage = ZSTDcs_ongoing;
    }
    else {
      sVar8 = 0;
    }
    if (srcSize == 0) {
      return sVar8;
    }
    pBVar17 = (cctx->blockState).matchState.window.base;
    if (pBVar17 == (BYTE *)0x0) {
LAB_0014e033:
      __assert_fail("window->base != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x2226,"U32 ZSTD_window_update(ZSTD_window_t *, const void *, size_t)");
    }
    pBVar2 = (cctx->blockState).matchState.window.dictBase;
    if (pBVar2 == (BYTE *)0x0) {
LAB_0014e052:
      __assert_fail("window->dictBase != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x2227,"U32 ZSTD_window_update(ZSTD_window_t *, const void *, size_t)");
    }
    ms = &(cctx->blockState).matchState;
    pBVar3 = (ms->window).nextSrc;
    if (pBVar3 == (BYTE *)src) {
      uVar16 = (ulong)(cctx->blockState).matchState.window.dictLimit;
      pBVar17 = pBVar2;
      uVar18 = (cctx->blockState).matchState.window.lowLimit;
    }
    else {
      uVar16 = (long)pBVar3 - (long)pBVar17;
      uVar18 = (cctx->blockState).matchState.window.dictLimit;
      (cctx->blockState).matchState.window.lowLimit = uVar18;
      if (uVar16 >> 0x20 != 0) goto LAB_0014e071;
      uVar14 = (uint)uVar16;
      (cctx->blockState).matchState.window.dictLimit = uVar14;
      (cctx->blockState).matchState.window.dictBase = pBVar17;
      (cctx->blockState).matchState.window.base = (BYTE *)((long)src - uVar16);
      if (uVar14 - uVar18 < 8) {
        (cctx->blockState).matchState.window.lowLimit = uVar14;
        uVar18 = uVar14;
      }
    }
    pBVar2 = (BYTE *)((long)src + srcSize);
    (ms->window).nextSrc = pBVar2;
    if ((pBVar17 + uVar18 < pBVar2) && (src < pBVar17 + (uVar16 & 0xffffffff))) {
      UVar15 = (U32)((long)pBVar2 - (long)pBVar17);
      if ((long)(uVar16 & 0xffffffff) < (long)pBVar2 - (long)pBVar17) {
        UVar15 = (U32)uVar16;
      }
      (cctx->blockState).matchState.window.lowLimit = UVar15;
    }
    if (pBVar3 != (BYTE *)src) {
      (cctx->blockState).matchState.nextToUpdate = (U32)uVar16;
    }
    if ((cctx->appliedParams).ldmParams.enableLdm != 0) {
      pBVar17 = (cctx->ldmState).window.base;
      if (pBVar17 == (BYTE *)0x0) goto LAB_0014e033;
      pBVar3 = (cctx->ldmState).window.dictBase;
      if (pBVar3 == (BYTE *)0x0) goto LAB_0014e052;
      pBVar4 = (cctx->ldmState).window.nextSrc;
      if (pBVar4 == (BYTE *)src) {
        uVar16 = (ulong)(cctx->ldmState).window.dictLimit;
        pBVar17 = pBVar3;
        uVar18 = (cctx->ldmState).window.lowLimit;
      }
      else {
        uVar16 = (long)pBVar4 - (long)pBVar17;
        uVar18 = (cctx->ldmState).window.dictLimit;
        (cctx->ldmState).window.lowLimit = uVar18;
        if (uVar16 >> 0x20 != 0) {
LAB_0014e071:
          __assert_fail("distanceFromBase == (size_t)(U32)distanceFromBase",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x222e,"U32 ZSTD_window_update(ZSTD_window_t *, const void *, size_t)");
        }
        uVar14 = (uint)uVar16;
        (cctx->ldmState).window.dictLimit = uVar14;
        (cctx->ldmState).window.dictBase = pBVar17;
        (cctx->ldmState).window.base = (BYTE *)((long)src - uVar16);
        if (uVar14 - uVar18 < 8) {
          (cctx->ldmState).window.lowLimit = uVar14;
          uVar18 = uVar14;
        }
      }
      (cctx->ldmState).window.nextSrc = pBVar2;
      if ((pBVar17 + uVar18 < pBVar2) && (src < pBVar17 + (uVar16 & 0xffffffff))) {
        UVar15 = (U32)((long)pBVar2 - (long)pBVar17);
        if ((long)(uVar16 & 0xffffffff) < (long)pBVar2 - (long)pBVar17) {
          UVar15 = (U32)uVar16;
        }
        (cctx->ldmState).window.lowLimit = UVar15;
      }
    }
    if (frame == 0) {
      ZSTD_overflowCorrectIfNeeded(ms,&cctx->workspace,&cctx->appliedParams,src,pBVar2);
      uVar16 = ZSTD_compressBlock_internal(cctx,dst,dstCapacity,src,srcSize,0);
    }
    else {
      uVar18 = (cctx->appliedParams).cParams.windowLog;
      if (0x1f < uVar18) {
        __assert_fail("cctx->appliedParams.cParams.windowLog <= ZSTD_WINDOWLOG_MAX",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                      ,0x344a,
                      "size_t ZSTD_compress_frameChunk(ZSTD_CCtx *, void *, size_t, const void *, size_t, U32)"
                     );
      }
      uVar16 = cctx->blockSize;
      if ((cctx->appliedParams).fParams.checksumFlag != 0) {
        ZSTD_XXH64_update(&cctx->xxhState,src,srcSize);
      }
      dst_00 = (short *)dst;
      sVar19 = srcSize;
      do {
        uVar14 = lastFrameChunk & 1;
        if (uVar16 < sVar19) {
          uVar14 = 0;
        }
        if (dstCapacity < 6) {
          return 0xffffffffffffffba;
        }
        if (sVar19 < uVar16) {
          uVar16 = sVar19;
        }
        iend = (void *)((long)src + uVar16);
        ZSTD_overflowCorrectIfNeeded(ms,&cctx->workspace,&cctx->appliedParams,src,iend);
        uVar7 = (int)iend - *(int *)&(cctx->blockState).matchState.window.base;
        uVar1 = (cctx->blockState).matchState.loadedDictEnd;
        if (uVar7 < uVar1) {
          __assert_fail("blockEndIdx >= loadedDictEnd",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x21fe,
                        "void ZSTD_checkDictValidity(const ZSTD_window_t *, const void *, U32, U32 *, const ZSTD_matchState_t **)"
                       );
        }
        if (uVar1 + (1 << ((byte)uVar18 & 0x1f)) < uVar7) {
          (cctx->blockState).matchState.loadedDictEnd = 0;
          (cctx->blockState).matchState.dictMatchState = (ZSTD_matchState_t *)0x0;
        }
        uVar1 = (cctx->blockState).matchState.window.lowLimit;
        if ((cctx->blockState).matchState.nextToUpdate < uVar1) {
          (cctx->blockState).matchState.nextToUpdate = uVar1;
        }
        uVar6 = (ushort)uVar14;
        if ((cctx->appliedParams).targetCBlockSize == 0) {
          sVar9 = ZSTD_compressBlock_internal
                            (cctx,(void *)((long)dst_00 + 3),dstCapacity - 3,src,uVar16,1);
          if (0xffffffffffffff88 < sVar9) {
            return sVar9;
          }
          if (sVar9 == 1) {
            uVar13 = 2;
            sVar12 = uVar16;
LAB_0014de52:
            *dst_00 = (uVar13 | uVar6) + (short)sVar12 * 8;
            *(char *)(dst_00 + 1) = (char)(sVar12 >> 0xd);
            uVar10 = sVar9 + 3;
          }
          else {
            if (sVar9 != 0) {
              uVar13 = 4;
              sVar12 = sVar9;
              goto LAB_0014de52;
            }
            uVar10 = uVar16 + 3;
            if (dstCapacity < uVar10) {
              return 0xffffffffffffffba;
            }
            *dst_00 = uVar6 + (short)uVar16 * 8;
            *(char *)(dst_00 + 1) = (char)(uVar16 >> 0xd);
            memcpy((void *)((long)dst_00 + 3),src,uVar16);
            if (0xffffffffffffff88 < uVar10) {
              return uVar10;
            }
          }
        }
        else {
          sVar9 = ZSTD_buildSeqStore(cctx,src,uVar16);
          if (0xffffffffffffff88 < sVar9) {
            return sVar9;
          }
          if ((sVar9 == 0) &&
             (uVar10 = ZSTD_compressSuperBlock(cctx,dst_00,dstCapacity,uVar14),
             uVar10 != 0xffffffffffffffba)) {
            if (0xffffffffffffff88 < uVar10) {
              return uVar10;
            }
            if ((uVar10 == 0) || (uVar16 + 3 <= uVar10)) goto LAB_0014dd4e;
            pZVar5 = (cctx->blockState).prevCBlock;
            pZVar11 = (cctx->blockState).nextCBlock;
            (cctx->blockState).prevCBlock = pZVar11;
            (cctx->blockState).nextCBlock = pZVar5;
          }
          else {
LAB_0014dd4e:
            uVar10 = uVar16 + 3;
            if (dstCapacity < uVar10) {
              return 0xffffffffffffffba;
            }
            *dst_00 = uVar6 + (short)uVar16 * 8;
            *(char *)(dst_00 + 1) = (char)(uVar16 >> 0xd);
            memcpy((void *)((long)dst_00 + 3),src,uVar16);
            if (0xffffffffffffff88 < uVar10) {
              return uVar10;
            }
            pZVar11 = (cctx->blockState).prevCBlock;
          }
          if ((pZVar11->entropy).fse.offcode_repeatMode == FSE_repeat_valid) {
            (pZVar11->entropy).fse.offcode_repeatMode = FSE_repeat_check;
          }
          if (uVar10 == 0) {
            __assert_fail("cSize > 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                          ,0x3464,
                          "size_t ZSTD_compress_frameChunk(ZSTD_CCtx *, void *, size_t, const void *, size_t, U32)"
                         );
          }
          if (uVar16 + 3 < uVar10) {
            __assert_fail("cSize <= blockSize + ZSTD_blockHeaderSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                          ,0x3465,
                          "size_t ZSTD_compress_frameChunk(ZSTD_CCtx *, void *, size_t, const void *, size_t, U32)"
                         );
          }
        }
        bVar21 = dstCapacity < uVar10;
        dstCapacity = dstCapacity - uVar10;
        if (bVar21) {
          __assert_fail("dstCapacity >= cSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x347d,
                        "size_t ZSTD_compress_frameChunk(ZSTD_CCtx *, void *, size_t, const void *, size_t, U32)"
                       );
        }
        dst_00 = (short *)((long)dst_00 + uVar10);
        cctx->isFirstBlock = 0;
        sVar19 = sVar19 - uVar16;
        src = iend;
      } while (sVar19 != 0);
      if ((lastFrameChunk != 0) && (dst < dst_00)) {
        cctx->stage = ZSTDcs_ending;
      }
      uVar16 = (long)dst_00 - (long)dst;
    }
    if (uVar16 < 0xffffffffffffff89) {
      uVar20 = srcSize + cctx->consumedSrcSize;
      cctx->consumedSrcSize = uVar20;
      uVar16 = uVar16 + sVar8;
      cctx->producedCSize = cctx->producedCSize + uVar16;
      uVar10 = cctx->pledgedSrcSizePlusOne;
      if (uVar10 == 0 && (cctx->appliedParams).fParams.contentSizeFlag != 0) {
        __assert_fail("!(cctx->appliedParams.fParams.contentSizeFlag && cctx->pledgedSrcSizePlusOne == 0)"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                      ,0x34fe,
                      "size_t ZSTD_compressContinue_internal(ZSTD_CCtx *, void *, size_t, const void *, size_t, U32, U32)"
                     );
      }
      sVar8 = 0xffffffffffffffb8;
      if (uVar20 + 1 <= uVar10) {
        sVar8 = uVar16;
      }
      if (uVar10 != 0) {
        uVar16 = sVar8;
      }
    }
  }
  return uVar16;
}

Assistant:

static size_t ZSTD_compressContinue_internal (ZSTD_CCtx* cctx,
                              void* dst, size_t dstCapacity,
                        const void* src, size_t srcSize,
                               U32 frame, U32 lastFrameChunk)
{
    ZSTD_matchState_t* const ms = &cctx->blockState.matchState;
    size_t fhSize = 0;

    DEBUGLOG(5, "ZSTD_compressContinue_internal, stage: %u, srcSize: %u",
                cctx->stage, (unsigned)srcSize);
    RETURN_ERROR_IF(cctx->stage==ZSTDcs_created, stage_wrong,
                    "missing init (ZSTD_compressBegin)");

    if (frame && (cctx->stage==ZSTDcs_init)) {
        fhSize = ZSTD_writeFrameHeader(dst, dstCapacity, &cctx->appliedParams,
                                       cctx->pledgedSrcSizePlusOne-1, cctx->dictID);
        FORWARD_IF_ERROR(fhSize);
        assert(fhSize <= dstCapacity);
        dstCapacity -= fhSize;
        dst = (char*)dst + fhSize;
        cctx->stage = ZSTDcs_ongoing;
    }

    if (!srcSize) return fhSize;  /* do not generate an empty block if no input */

    if (!ZSTD_window_update(&ms->window, src, srcSize)) {
        ms->nextToUpdate = ms->window.dictLimit;
    }
    if (cctx->appliedParams.ldmParams.enableLdm) {
        ZSTD_window_update(&cctx->ldmState.window, src, srcSize);
    }

    if (!frame) {
        /* overflow check and correction for block mode */
        ZSTD_overflowCorrectIfNeeded(
            ms, &cctx->workspace, &cctx->appliedParams,
            src, (BYTE const*)src + srcSize);
    }

    DEBUGLOG(5, "ZSTD_compressContinue_internal (blockSize=%u)", (unsigned)cctx->blockSize);
    {   size_t const cSize = frame ?
                             ZSTD_compress_frameChunk (cctx, dst, dstCapacity, src, srcSize, lastFrameChunk) :
                             ZSTD_compressBlock_internal (cctx, dst, dstCapacity, src, srcSize, 0 /* frame */);
        FORWARD_IF_ERROR(cSize);
        cctx->consumedSrcSize += srcSize;
        cctx->producedCSize += (cSize + fhSize);
        assert(!(cctx->appliedParams.fParams.contentSizeFlag && cctx->pledgedSrcSizePlusOne == 0));
        if (cctx->pledgedSrcSizePlusOne != 0) {  /* control src size */
            ZSTD_STATIC_ASSERT(ZSTD_CONTENTSIZE_UNKNOWN == (unsigned long long)-1);
            RETURN_ERROR_IF(
                cctx->consumedSrcSize+1 > cctx->pledgedSrcSizePlusOne,
                srcSize_wrong,
                "error : pledgedSrcSize = %u, while realSrcSize >= %u",
                (unsigned)cctx->pledgedSrcSizePlusOne-1,
                (unsigned)cctx->consumedSrcSize);
        }
        return cSize + fhSize;
    }
}